

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O1

void __thiscall
cbtHashMap<cbtHashString,_cbtCollisionObject_*>::insert
          (cbtHashMap<cbtHashString,_cbtCollisionObject_*> *this,cbtHashString *key,
          cbtCollisionObject **value)

{
  int iVar1;
  int iVar2;
  cbtCollisionObject **ptr;
  cbtHashString *pcVar3;
  pointer pcVar4;
  int *piVar5;
  string *psVar6;
  int iVar7;
  cbtCollisionObject **ppcVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int _Count;
  int iVar12;
  
  uVar11 = key->m_hash;
  iVar1 = (this->m_valueArray).m_capacity;
  iVar7 = findIndex(this,key);
  if (iVar7 == -1) {
    iVar7 = (this->m_valueArray).m_size;
    iVar2 = (this->m_valueArray).m_capacity;
    if (iVar7 == iVar2) {
      iVar12 = 1;
      if (iVar7 != 0) {
        iVar12 = iVar7 * 2;
      }
      if (iVar2 < iVar12) {
        if (iVar12 == 0) {
          ppcVar8 = (cbtCollisionObject **)0x0;
        }
        else {
          ppcVar8 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar12 << 3,0x10);
        }
        lVar9 = (long)(this->m_valueArray).m_size;
        if (0 < lVar9) {
          lVar10 = 0;
          do {
            ppcVar8[lVar10] = (this->m_valueArray).m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
        ptr = (this->m_valueArray).m_data;
        if (ptr != (cbtCollisionObject **)0x0) {
          if ((this->m_valueArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr);
          }
          (this->m_valueArray).m_data = (cbtCollisionObject **)0x0;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppcVar8;
        (this->m_valueArray).m_capacity = iVar12;
      }
    }
    iVar12 = (this->m_valueArray).m_size;
    (this->m_valueArray).m_data[iVar12] = *value;
    (this->m_valueArray).m_size = iVar12 + 1;
    iVar12 = (this->m_keyArray).m_size;
    if (iVar12 == (this->m_keyArray).m_capacity) {
      _Count = 1;
      if (iVar12 != 0) {
        _Count = iVar12 * 2;
      }
      cbtAlignedObjectArray<cbtHashString>::reserve(&this->m_keyArray,_Count);
    }
    pcVar3 = (this->m_keyArray).m_data;
    iVar12 = (this->m_keyArray).m_size;
    psVar6 = &pcVar3[iVar12].m_string1;
    (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
    pcVar4 = (key->m_string1)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar3 + iVar12),pcVar4,pcVar4 + (key->m_string1)._M_string_length);
    *(uint *)(psVar6 + 1) = key->m_hash;
    piVar5 = &(this->m_keyArray).m_size;
    *piVar5 = *piVar5 + 1;
    if (iVar2 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar11 = (this->m_valueArray).m_capacity - 1U & key->m_hash;
    }
    else {
      uVar11 = iVar1 - 1U & uVar11;
    }
    piVar5 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar7] = piVar5[(int)uVar11];
    piVar5[(int)uVar11] = iVar7;
  }
  else {
    (this->m_valueArray).m_data[iVar7] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}